

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContextOptimizationOverrideInfo.cpp
# Opt level: O0

void __thiscall
Js::ScriptContextOptimizationOverrideInfo::Verify(ScriptContextOptimizationOverrideInfo *this)

{
  ScriptContextOptimizationOverrideInfo *this_local;
  
  if (this->crossSiteRoot != (ScriptContextOptimizationOverrideInfo *)0x0) {
    ForEachCrossSiteInfo<Js::ScriptContextOptimizationOverrideInfo::Verify()::__0>
              (this,(anon_class_8_1_8991fb9c)this);
  }
  return;
}

Assistant:

void
ScriptContextOptimizationOverrideInfo::Verify()
{
    if (this->crossSiteRoot == nullptr)
    {
        return;
    }

    this->ForEachCrossSiteInfo([this](ScriptContextOptimizationOverrideInfo * i)
    {
        Assert(i->crossSiteRoot == this->crossSiteRoot);
        Assert(i->sideEffects == this->sideEffects);
        Assert(i->arraySetElementFastPathVtable == this->arraySetElementFastPathVtable);
        Assert(i->intArraySetElementFastPathVtable == this->intArraySetElementFastPathVtable);
        Assert(i->floatArraySetElementFastPathVtable == this->floatArraySetElementFastPathVtable);
    });
}